

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::~cmComputeTargetDepends(cmComputeTargetDepends *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ComponentHead).super__Vector_base<int,_std::allocator<int>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_int>,_std::_Select1st<std::pair<const_cmTarget_*const,_int>_>,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
  ::~_Rb_tree(&(this->TargetIndex)._M_t);
  std::_Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::~_Vector_base
            (&(this->Targets).
              super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>);
  return;
}

Assistant:

cmComputeTargetDepends::~cmComputeTargetDepends()
{
}